

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlCopyPropInternal(xmlDocPtr doc,xmlNodePtr target,xmlAttrPtr cur)

{
  int iVar1;
  xmlNsPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlChar *value;
  xmlChar *id;
  xmlNodePtr tmp;
  xmlNodePtr pred;
  xmlNodePtr root;
  xmlNsPtr ns;
  xmlAttrPtr ret;
  xmlAttrPtr cur_local;
  xmlNodePtr target_local;
  xmlDocPtr doc_local;
  
  if (cur == (xmlAttrPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((target == (xmlNodePtr)0x0) || (target->type == XML_ELEMENT_NODE)) {
    if (target == (xmlNodePtr)0x0) {
      if (doc == (xmlDocPtr)0x0) {
        if (cur->parent == (_xmlNode *)0x0) {
          if (cur->children == (_xmlNode *)0x0) {
            ns = (xmlNsPtr)xmlNewDocProp((xmlDocPtr)0x0,cur->name,(xmlChar *)0x0);
          }
          else {
            ns = (xmlNsPtr)xmlNewDocProp(cur->children->doc,cur->name,(xmlChar *)0x0);
          }
        }
        else {
          ns = (xmlNsPtr)xmlNewDocProp(cur->parent->doc,cur->name,(xmlChar *)0x0);
        }
      }
      else {
        ns = (xmlNsPtr)xmlNewDocProp(doc,cur->name,(xmlChar *)0x0);
      }
    }
    else {
      ns = (xmlNsPtr)xmlNewDocProp(target->doc,cur->name,(xmlChar *)0x0);
    }
    if (ns == (xmlNsPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      ns->context = (_xmlDoc *)target;
      if ((cur->ns == (xmlNs *)0x0) || (target == (xmlNodePtr)0x0)) {
        ns[1].prefix = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlSearchNs(target->doc,target,cur->ns->prefix);
        if (pxVar2 == (xmlNsPtr)0x0) {
          pxVar2 = xmlSearchNs(cur->doc,cur->parent,cur->ns->prefix);
          if (pxVar2 != (xmlNsPtr)0x0) {
            tmp = (xmlNodePtr)0x0;
            for (pred = target; pred->parent != (_xmlNode *)0x0; pred = pred->parent) {
              tmp = pred;
            }
            if ((_xmlDoc *)pred == target->doc) {
              pred = tmp;
            }
            pxVar2 = xmlNewNs(pred,pxVar2->href,pxVar2->prefix);
            ns[1].prefix = (xmlChar *)pxVar2;
          }
        }
        else {
          iVar1 = xmlStrEqual(pxVar2->href,cur->ns->href);
          if (iVar1 == 0) {
            pxVar2 = xmlNewReconciledNs(target->doc,target,cur->ns);
            ns[1].prefix = (xmlChar *)pxVar2;
          }
          else {
            ns[1].prefix = (xmlChar *)pxVar2;
          }
        }
      }
      if (cur->children != (_xmlNode *)0x0) {
        pxVar3 = xmlStaticCopyNodeList(cur->children,(xmlDocPtr)ns[1].href,(xmlNodePtr)ns);
        ns->prefix = (xmlChar *)pxVar3;
        ns->_private = (void *)0x0;
        for (id = ns->prefix; id != (xmlChar *)0x0; id = *(xmlChar **)(id + 0x30)) {
          if (*(long *)(id + 0x30) == 0) {
            ns->_private = id;
          }
        }
      }
      if (((((target != (xmlNodePtr)0x0) && (cur != (xmlAttrPtr)0x0)) &&
           (target->doc != (_xmlDoc *)0x0)) &&
          ((cur->doc != (_xmlDoc *)0x0 && (cur->doc->ids != (void *)0x0)))) &&
         ((cur->parent != (_xmlNode *)0x0 &&
          ((iVar1 = xmlIsID(cur->doc,cur->parent,cur), iVar1 != 0 &&
           (value = xmlNodeListGetString(cur->doc,cur->children,1), value != (xmlChar *)0x0)))))) {
        xmlAddID((xmlValidCtxtPtr)0x0,target->doc,value,(xmlAttrPtr)ns);
        (*xmlFree)(value);
      }
      doc_local = (xmlDocPtr)ns;
    }
  }
  else {
    doc_local = (xmlDocPtr)0x0;
  }
  return (xmlAttrPtr)doc_local;
}

Assistant:

static xmlAttrPtr
xmlCopyPropInternal(xmlDocPtr doc, xmlNodePtr target, xmlAttrPtr cur) {
    xmlAttrPtr ret;

    if (cur == NULL) return(NULL);
    if ((target != NULL) && (target->type != XML_ELEMENT_NODE))
        return(NULL);
    if (target != NULL)
	ret = xmlNewDocProp(target->doc, cur->name, NULL);
    else if (doc != NULL)
	ret = xmlNewDocProp(doc, cur->name, NULL);
    else if (cur->parent != NULL)
	ret = xmlNewDocProp(cur->parent->doc, cur->name, NULL);
    else if (cur->children != NULL)
	ret = xmlNewDocProp(cur->children->doc, cur->name, NULL);
    else
	ret = xmlNewDocProp(NULL, cur->name, NULL);
    if (ret == NULL) return(NULL);
    ret->parent = target;

    if ((cur->ns != NULL) && (target != NULL)) {
      xmlNsPtr ns;

      ns = xmlSearchNs(target->doc, target, cur->ns->prefix);
      if (ns == NULL) {
        /*
         * Humm, we are copying an element whose namespace is defined
         * out of the new tree scope. Search it in the original tree
         * and add it at the top of the new tree
         */
        ns = xmlSearchNs(cur->doc, cur->parent, cur->ns->prefix);
        if (ns != NULL) {
          xmlNodePtr root = target;
          xmlNodePtr pred = NULL;

          while (root->parent != NULL) {
            pred = root;
            root = root->parent;
          }
          if (root == (xmlNodePtr) target->doc) {
            /* correct possibly cycling above the document elt */
            root = pred;
          }
          ret->ns = xmlNewNs(root, ns->href, ns->prefix);
        }
      } else {
        /*
         * we have to find something appropriate here since
         * we can't be sure, that the namespace we found is identified
         * by the prefix
         */
        if (xmlStrEqual(ns->href, cur->ns->href)) {
          /* this is the nice case */
          ret->ns = ns;
        } else {
          /*
           * we are in trouble: we need a new reconciled namespace.
           * This is expensive
           */
          ret->ns = xmlNewReconciledNs(target->doc, target, cur->ns);
        }
      }

    } else
        ret->ns = NULL;

    if (cur->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(cur->children, ret->doc, (xmlNodePtr) ret);
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    /* tmp->parent = (xmlNodePtr)ret; */
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    /*
     * Try to handle IDs
     */
    if ((target!= NULL) && (cur!= NULL) &&
	(target->doc != NULL) && (cur->doc != NULL) &&
	(cur->doc->ids != NULL) && (cur->parent != NULL)) {
	if (xmlIsID(cur->doc, cur->parent, cur)) {
	    xmlChar *id;

	    id = xmlNodeListGetString(cur->doc, cur->children, 1);
	    if (id != NULL) {
		xmlAddID(NULL, target->doc, id, ret);
		xmlFree(id);
	    }
	}
    }
    return(ret);
}